

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreensurface.cpp
# Opt level: O3

void __thiscall QOffscreenSurface::format(QOffscreenSurface *this)

{
  format(this);
  return;
}

Assistant:

QSurfaceFormat QOffscreenSurface::format() const
{
    Q_D(const QOffscreenSurface);
    if (d->platformOffscreenSurface)
        return d->platformOffscreenSurface->format();
    if (d->offscreenWindow)
        return d->offscreenWindow->format();
    return d->requestedFormat;
}